

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

uint __thiscall dg::vr::RelationsAnalyzer::analyze(RelationsAnalyzer *this,uint maxPass)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  Function *function;
  
  lVar6 = *(long *)(*(long *)(this + 0x30) + 0x20);
  lVar5 = *(long *)(this + 0x30) + 0x18;
  if (lVar6 == lVar5) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      function = (Function *)(lVar6 + -0x38);
      if (lVar6 == 0) {
        function = (Function *)0x0;
      }
      cVar1 = llvm::GlobalValue::isDeclaration();
      if (cVar1 == '\0') {
        uVar4 = 0;
        if (maxPass != 0) {
          do {
            bVar2 = passFunction(this,function,false);
            uVar4 = uVar4 + 1;
            if (!bVar2) break;
          } while (uVar4 < maxPass);
        }
        if (uVar3 <= uVar4) {
          uVar3 = uVar4;
        }
      }
      lVar6 = *(long *)(lVar6 + 8);
    } while (lVar6 != lVar5);
  }
  return uVar3;
}

Assistant:

unsigned RelationsAnalyzer::analyze(unsigned maxPass) {
    unsigned maxExecutedPass = 0;

    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        bool changed = true;
        unsigned passNum = 0;
        while (changed && passNum < maxPass) {
            changed = passFunction(function, false); // passNum + 1 == maxPass);
            ++passNum;
        }

        maxExecutedPass = std::max(maxExecutedPass, passNum);
    }

    return maxExecutedPass;
}